

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

void __thiscall
toml::basic_value<toml::type_config>::throw_bad_cast
          (basic_value<toml::type_config> *this,string *funcname,value_t ty)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  error_info *err;
  string local_118;
  source_location local_f8;
  error_info local_80;
  
  puVar2 = (undefined8 *)__cxa_allocate_exception(0xa0);
  detail::make_type_error<toml::type_config>(&local_80,this,funcname,ty);
  format_error_abi_cxx11_(&local_118,(toml *)&local_80,err);
  source_location::source_location(&local_f8,&this->region_);
  *puVar2 = &PTR__type_error_004da7d0;
  puVar2[1] = puVar2 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == &local_118.field_2) {
    puVar2[3] = CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                         local_118.field_2._M_local_buf[0]);
    puVar2[4] = local_118.field_2._8_8_;
  }
  else {
    puVar2[1] = local_118._M_dataplus._M_p;
    puVar2[3] = CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                         local_118.field_2._M_local_buf[0]);
  }
  puVar2[2] = local_118._M_string_length;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_f8.file_name_.field_2;
  *(undefined4 *)(puVar2 + 0xb) = (undefined4)local_f8.last_offset_;
  *(undefined4 *)((long)puVar2 + 0x5c) = local_f8.last_offset_._4_4_;
  *(undefined4 *)(puVar2 + 0xc) = (undefined4)local_f8.length_;
  *(undefined4 *)((long)puVar2 + 100) = local_f8.length_._4_4_;
  *(undefined4 *)(puVar2 + 9) = (undefined4)local_f8.last_line_;
  *(undefined4 *)((long)puVar2 + 0x4c) = local_f8.last_line_._4_4_;
  *(undefined4 *)(puVar2 + 10) = (undefined4)local_f8.last_column_;
  *(undefined4 *)((long)puVar2 + 0x54) = local_f8.last_column_._4_4_;
  *(undefined4 *)(puVar2 + 7) = (undefined4)local_f8.first_column_;
  *(undefined4 *)((long)puVar2 + 0x3c) = local_f8.first_column_._4_4_;
  *(undefined4 *)(puVar2 + 8) = (undefined4)local_f8.first_offset_;
  *(undefined4 *)((long)puVar2 + 0x44) = local_f8.first_offset_._4_4_;
  puVar2[5] = local_f8._0_8_;
  puVar2[6] = local_f8.first_line_;
  puVar2[0xd] = puVar2 + 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file_name_._M_dataplus._M_p == paVar1) {
    puVar2[0xf] = CONCAT71(local_f8.file_name_.field_2._M_allocated_capacity._1_7_,
                           local_f8.file_name_.field_2._M_local_buf[0]);
    puVar2[0x10] = local_f8.file_name_.field_2._8_8_;
  }
  else {
    puVar2[0xd] = local_f8.file_name_._M_dataplus._M_p;
    puVar2[0xf] = CONCAT71(local_f8.file_name_.field_2._M_allocated_capacity._1_7_,
                           local_f8.file_name_.field_2._M_local_buf[0]);
  }
  puVar2[0xe] = local_f8.file_name_._M_string_length;
  local_f8.file_name_._M_string_length = 0;
  local_f8.file_name_.field_2._M_local_buf[0] = '\0';
  puVar2[0x11] = local_f8.line_str_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  puVar2[0x12] = local_f8.line_str_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  puVar2[0x13] = local_f8.line_str_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_f8.file_name_._M_dataplus._M_p = (pointer)paVar1;
  __cxa_throw(puVar2,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]]
    void throw_bad_cast(const std::string& funcname, const value_t ty) const
    {
        throw type_error(format_error(detail::make_type_error(*this, funcname, ty)),
                         this->location());
    }